

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O2

uint8_t * apx_attributeParser_parse_port_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_portAttributes_t *attr)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *pBegin;
  uint8_t *puVar3;
  uint8_t *pBegin_00;
  apx_error_t error;
  
  if (((end != (uint8_t *)0x0) && (begin != (uint8_t *)0x0)) && (begin <= end)) {
    do {
      if (end <= begin) {
        return begin;
      }
      puVar2 = bstr_lstrip(begin,end);
      if (puVar2 == end) {
        return puVar2;
      }
      uVar1 = *puVar2;
      if (uVar1 == 'Q') {
        pBegin = puVar2 + 1;
        if (pBegin < end) {
          if (*pBegin != '[') goto LAB_001229d4;
          puVar3 = bstr_lstrip(puVar2 + 2,end);
          if (puVar3 < end) {
            pBegin_00 = apx_parserBase_parse_u32(puVar3,end,&attr->queue_length);
            if (pBegin_00 <= puVar3) goto LAB_001229d4;
            puVar3 = bstr_lstrip(pBegin_00,end);
            if (puVar3 < end) {
              pBegin = puVar3 + 1;
              if (*puVar3 != ']') {
                pBegin = (uint8_t *)0x0;
              }
              goto LAB_001228f6;
            }
          }
        }
      }
      else {
        if (uVar1 != 'P') {
          if (uVar1 == '=') {
            pBegin = apx_attributeParser_parse_initializer(self,puVar2 + 1,end,&attr->init_value);
LAB_001228f6:
            if (puVar2 < pBegin) goto LAB_00122993;
          }
LAB_001229d4:
          error = 3;
          goto LAB_001229bd;
        }
        pBegin = puVar2 + 1;
        attr->is_parameter = true;
      }
LAB_00122993:
      puVar2 = bstr_lstrip(pBegin,end);
      if (puVar2 == end) {
        return puVar2;
      }
      if (*puVar2 != ',') {
        apx_attributeParser_set_error(self,3,puVar2);
        return (uint8_t *)0x0;
      }
      begin = puVar2 + 1;
    } while( true );
  }
  puVar2 = (uint8_t *)0x0;
  error = 1;
LAB_001229bd:
  apx_attributeParser_set_error(self,error,puVar2);
  return puVar2;
}

Assistant:

uint8_t const* apx_attributeParser_parse_port_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_portAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, NULL);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_port_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;

}